

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O0

void setDataObject_c(char *name,char *type,void *value)

{
  MockSupport *this;
  SimpleString local_40;
  SimpleString local_30;
  void *local_20;
  void *value_local;
  char *type_local;
  char *name_local;
  
  this = currentMockSupport;
  local_20 = value;
  value_local = type;
  type_local = name;
  SimpleString::SimpleString(&local_30,name);
  SimpleString::SimpleString(&local_40,(char *)value_local);
  MockSupport::setDataObject(this,&local_30,&local_40,local_20);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  return;
}

Assistant:

void setDataObject_c(const char* name, const char* type, void* value)
{
    currentMockSupport->setDataObject(name, type, value);
}